

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O2

int __thiscall
FIX::MessageStoreExceptionWrapper::getNextSenderMsgSeqNum
          (MessageStoreExceptionWrapper *this,bool *threw,IOException *ex)

{
  int iVar1;
  
  *threw = false;
  iVar1 = (**(code **)(**(long **)this + 0x20))();
  return iVar1;
}

Assistant:

int MessageStoreExceptionWrapper::getNextSenderMsgSeqNum( bool& threw, IOException& ex ) const
{
  threw = false;
  try { return m_pStore->getNextSenderMsgSeqNum(); }
  catch ( IOException & e ) { threw = true; ex = e; return 0; }
}